

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-options.c
# Opt level: O2

_Bool ignore_tval(wchar_t tval)

{
  ulong uVar1;
  tval_desc *ptVar2;
  
  uVar1 = 0;
  for (ptVar2 = sval_dependent;
      (uVar1 != 0x11 && ((kb_info[tval].num_svals == 0 || (ptVar2->tval != tval))));
      ptVar2 = ptVar2 + 1) {
    uVar1 = uVar1 + 1;
  }
  return uVar1 < 0x11;
}

Assistant:

bool ignore_tval(int tval)
{
	size_t i;

	/* Only ignore if the tval's allowed */
	for (i = 0; i < N_ELEMENTS(sval_dependent); i++) {
		if (kb_info[tval].num_svals == 0) continue;
		if (tval == sval_dependent[i].tval)
			return true;
	}

	return false;
}